

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTests.cpp
# Opt level: O3

void (anonymous_namespace)::
     test_cartesian_product<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
               (Results *expected,
               _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *converter,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *input0,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *inputs)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_12c;
  _Base_ptr local_128;
  Results *local_120;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_118;
  Result local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  anon_union_24_2_13149d16_for_String_3 local_a0;
  String local_88;
  String local_60;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_40;
  Enum local_38;
  
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.converter = anon_unknown.dwarf_34311b::concatenate_2_strings_comma_separated;
  p_Var4 = *(_Rb_tree_node_base **)(converter + 0x18);
  p_Var3 = (input0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(input0->_M_t)._M_impl.super__Rb_tree_header;
  local_128 = p_Var3;
  local_120 = expected;
  if ((_Rb_tree_header *)p_Var3 != p_Var5 && p_Var4 != (_Rb_tree_node_base *)(converter + 8)) {
    do {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_d0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var4 + 1),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var3 + 1));
      ApprovalTests::CartesianProduct::Detail::
      apply<(anonymous_namespace)::AccumulateResults<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&)>&,std::tuple<std::__cxx11::string,std::__cxx11::string>>
                (&local_118,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d0);
      if ((anon_union_24_2_13149d16_for_String_3 *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,(ulong)(local_a0.data.ptr + 1));
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 == p_Var5) {
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        p_Var3 = local_128;
      }
    } while (p_Var4 != (_Rb_tree_node_base *)(converter + 8));
  }
  doctest::String::String((String *)&local_f0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_d0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/CartesianProductTests.cpp"
             ,0x45,"results_store.results == expected","",(String *)&local_f0);
  doctest::String::~String((String *)&local_f0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_12c,DT_REQUIRE);
  local_40 = &local_118;
  local_38 = local_12c.m_at;
  doctest::detail::
  Expression_lhs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
  operator==(&local_f0,
             (Expression_lhs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              *)&local_40,local_120);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_d0,&local_f0);
  doctest::String::~String(&local_f0.m_decomp);
  dVar2 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)local_d0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL == '\0') {
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_d0);
    doctest::String::~String(&local_60);
    doctest::String::~String(&local_88);
    doctest::String::~String((String *)&local_a0.data);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118.results);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void test_cartesian_product(const Results& expected,
                                Converter&& converter,
                                const Container& input0,
                                const Containers&... inputs)
    {
        auto results_store =
            AccumulateResults<Converter>{Results(), std::forward<Converter>(converter)};
        CartesianProduct::cartesian_product(results_store, input0, inputs...);
        REQUIRE(results_store.results == expected);
    }